

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariants(AsciiParser *this,VariantSelectionMap *out_map)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  string var;
  string key;
  ostringstream ss_e;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar3 = Expect(this,'{');
  if ((bVar3) && (bVar3 = SkipWhitespaceAndNewline(this,true), bVar3)) {
    do {
      pSVar2 = this->_sr;
      uVar6 = pSVar2->idx_;
      if ((pSVar2->length_ <= uVar6) || (pSVar2->binary_[uVar6] == '\0')) goto LAB_003a630b;
      if (pSVar2->length_ < uVar6 + 1) {
LAB_003a60f3:
        iVar7 = 1;
      }
      else {
        uVar1 = pSVar2->binary_[uVar6];
        pSVar2->idx_ = uVar6 + 1;
        iVar7 = 3;
        if (uVar1 != '}') {
          uVar6 = pSVar2->idx_ - 1;
          if ((long)uVar6 < 0) goto LAB_003a60f3;
          iVar7 = 1;
          if (uVar6 <= pSVar2->length_) {
            pSVar2->idx_ = uVar6;
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            local_1e8._M_string_length = 0;
            local_1e8.field_2._M_local_buf[0] = '\0';
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            local_208._M_string_length = 0;
            local_208.field_2._M_local_buf[0] = '\0';
            bVar3 = ParseVariantsElement(this,&local_1e8,&local_208);
            if (bVar3) {
              iVar7 = 1;
              bVar3 = SkipWhitespaceAndNewline(this,true);
              if (bVar3) {
                pmVar4 = ::std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](out_map,&local_1e8);
                ::std::__cxx11::string::_M_assign((string *)pmVar4);
                iVar7 = 0;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseVariants",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x42b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Failed to parse an element of `variants`.",0x29);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,&local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base(local_138);
              iVar7 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                       local_208.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,
                              CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                       local_1e8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    } while (iVar7 == 0);
    if (iVar7 != 1) {
LAB_003a630b:
      bVar3 = SkipWhitespaceAndNewline(this,true);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseVariants(VariantSelectionMap *out_map) {
  // '{' (string name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      std::string var;
      if (!ParseVariantsElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse an element of `variants`.");
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Add to variants: " << key);
      (*out_map)[key] = var;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}